

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

node_ptr __thiscall
dtc::fdt::device_tree::create_fragment_wrapper(device_tree *this,node_ptr *node,int *fragnum)

{
  int *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  node_ptr nVar1;
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  symbols;
  shared_ptr<dtc::fdt::property> prop;
  node_ptr wrapper;
  node_ptr fragment;
  string propname;
  property_value v;
  string local_c0;
  string fragment_address;
  property_value local_80;
  
  std::__cxx11::to_string(&v.label,*in_RCX);
  std::operator+(&fragment_address,"fragment@",&v.label);
  std::__cxx11::string::~string((string *)&v);
  *in_RCX = *in_RCX + 1;
  symbols.
  super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  symbols.
  super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  symbols.
  super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&v,"",(allocator<char> *)&propname);
  fdt::node::create_special_node((node *)this,&v.label,&symbols);
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v,"__overlay__",(allocator<char> *)&propname);
  fdt::node::create_special_node((node *)&wrapper,&v.label,&symbols);
  std::__cxx11::string::~string((string *)&v);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  property_value::property_value(&v,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  propname._M_dataplus._M_p = (pointer)&propname.field_2;
  propname._M_string_length = 0;
  propname.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&v.string_data);
  if (*(char *)(*(long *)fragnum + 0x58) == '\0') {
    std::__cxx11::string::assign((char *)&propname);
    v.type = PHANDLE;
  }
  else {
    std::__cxx11::string::assign((char *)&propname);
    v.type = STRING;
  }
  std::__cxx11::string::string((string *)&fragment,(string *)&propname);
  std::make_shared<dtc::fdt::property,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop);
  std::__cxx11::string::~string((string *)&fragment);
  property_value::property_value(&local_80,&v);
  std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
            (&(prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              values,&local_80);
  property_value::~property_value(&local_80);
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::push_back(&symbols,&prop);
  fdt::node::create_special_node((node *)&fragment,&fragment_address,&symbols);
  fdt::node::merge_node
            (wrapper.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (node_ptr *)fragnum);
  std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>::
  emplace_back<std::shared_ptr<dtc::fdt::node>>
            ((vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
              *)&(fragment.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 children,&wrapper);
  std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>::
  emplace_back<std::shared_ptr<dtc::fdt::node>>
            ((vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
              *)(*(long *)this + 0xa0),&fragment);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fragment.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&propname);
  property_value::~property_value(&v);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wrapper.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::~vector(&symbols);
  std::__cxx11::string::~string((string *)&fragment_address);
  nVar1.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  nVar1.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (node_ptr)nVar1.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

node_ptr
device_tree::create_fragment_wrapper(node_ptr &node, int &fragnum)
{
	// In a plugin, we can massage these non-/ root nodes into into a fragment
	std::string fragment_address = "fragment@" + std::to_string(fragnum);
	++fragnum;

	std::vector<property_ptr> symbols;

	// Intentionally left empty
	node_ptr newroot = node::create_special_node("", symbols);
	node_ptr wrapper = node::create_special_node("__overlay__", symbols);

	// Generate the fragment with $propname = <&name>
	property_value v;
	std::string propname;
	v.string_data = node->name;
	if (!node->name_is_path_reference)
	{
		propname = "target";
		v.type = property_value::PHANDLE;
	}
	else
	{
		propname = "target-path";
		v.type = property_value::STRING;
	}
	auto prop = std::make_shared<property>(std::string(propname));
	prop->add_value(v);
	symbols.push_back(prop);

	node_ptr fragment = node::create_special_node(fragment_address, symbols);

	wrapper->merge_node(node);
	fragment->add_child(std::move(wrapper));
	newroot->add_child(std::move(fragment));
	return newroot;
}